

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::pointIsInSector
          (SimpleToMonotone *this,int vertex,int sector)

{
  QPodPoint *v2;
  int iVar1;
  int iVar2;
  uint uVar3;
  Edge *pEVar4;
  QPodPoint *pQVar5;
  bool bVar6;
  long lVar7;
  QPodPoint *v1;
  long lVar8;
  QPodPoint *v3;
  
  lVar7 = (long)sector;
  pEVar4 = (this->m_edges).buffer;
  pQVar5 = (this->m_parent->m_vertices).buffer;
  v2 = pQVar5 + pEVar4[lVar7].from;
  iVar1 = v2->x;
  iVar2 = v2->y;
  while( true ) {
    lVar8 = lVar7;
    if ((pQVar5[pEVar4[vertex].from].x != iVar1) || (pQVar5[pEVar4[vertex].from].y != iVar2)) break;
    vertex = pEVar4[vertex].next;
  }
  do {
    uVar3 = pEVar4[pEVar4[lVar8].next].from;
    if (pQVar5[uVar3].x != iVar1) break;
    lVar8 = (long)pEVar4[lVar8].next;
  } while (pQVar5[uVar3].y == iVar2);
  v3 = pQVar5 + uVar3;
  do {
    lVar7 = (long)pEVar4[lVar7].previous;
    uVar3 = pEVar4[lVar7].from;
    if (pQVar5[uVar3].x != iVar1) break;
  } while (pQVar5[uVar3].y == iVar2);
  v1 = pQVar5 + uVar3;
  if (this->m_clockwiseOrder == true) {
    v1 = v3;
    v3 = pQVar5 + uVar3;
  }
  bVar6 = pointIsInSector(this,pQVar5 + pEVar4[vertex].from,v1,v2,v3);
  return bVar6;
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::pointIsInSector(int vertex, int sector)
{
    const QPodPoint &center = m_parent->m_vertices.at(m_edges.at(sector).from);
    // Handle degenerate edges.
    while (m_parent->m_vertices.at(m_edges.at(vertex).from) == center)
        vertex = m_edges.at(vertex).next;
    int next = m_edges.at(sector).next;
    while (m_parent->m_vertices.at(m_edges.at(next).from) == center)
        next = m_edges.at(next).next;
    int previous = m_edges.at(sector).previous;
    while (m_parent->m_vertices.at(m_edges.at(previous).from) == center)
        previous = m_edges.at(previous).previous;

    const QPodPoint &p = m_parent->m_vertices.at(m_edges.at(vertex).from);
    const QPodPoint &v1 = m_parent->m_vertices.at(m_edges.at(previous).from);
    const QPodPoint &v3 = m_parent->m_vertices.at(m_edges.at(next).from);
    if (m_clockwiseOrder)
        return pointIsInSector(p, v3, center, v1);
    else
        return pointIsInSector(p, v1, center, v3);
}